

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O3

int Mop_ManRemoveIdentical(Mop_Man_t *p,Vec_Int_t *vGroup)

{
  ulong *puVar1;
  int iVar2;
  int Entry;
  uint uVar3;
  word *pwVar4;
  int *piVar5;
  word *pwVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int local_50;
  
  uVar15 = vGroup->nSize;
  if (0 < (int)uVar15) {
    lVar14 = 0;
    lVar10 = 1;
    local_50 = 0;
    do {
      iVar2 = vGroup->pArray[lVar14];
      if (iVar2 != -1) {
        uVar7 = p->nWordsIn * iVar2;
        if (((int)uVar7 < 0) || (p->vWordsIn->nSize <= (int)uVar7)) {
LAB_00336ae8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        if (lVar14 + 1 < (long)(int)uVar15) {
          pwVar4 = p->vWordsIn->pArray;
          lVar11 = lVar10;
          do {
            piVar5 = vGroup->pArray;
            Entry = piVar5[lVar11];
            if (Entry != -1) {
              uVar8 = p->nWordsIn * Entry;
              if (((int)uVar8 < 0) || (p->vWordsIn->nSize <= (int)uVar8)) goto LAB_00336ae8;
              iVar9 = bcmp(pwVar4 + uVar7,p->vWordsIn->pArray + uVar8,(long)p->nWordsIn << 3);
              if (iVar9 == 0) {
                uVar15 = p->nWordsOut;
                uVar8 = uVar15 * iVar2;
                if ((int)uVar8 < 0) goto LAB_00336ae8;
                uVar3 = p->vWordsOut->nSize;
                if ((((int)uVar3 <= (int)uVar8) || (uVar12 = uVar15 * Entry, (int)uVar12 < 0)) ||
                   (uVar3 <= uVar12)) goto LAB_00336ae8;
                if (0 < (int)uVar15) {
                  pwVar6 = p->vWordsOut->pArray;
                  uVar13 = 0;
                  do {
                    puVar1 = pwVar6 + uVar8 + uVar13;
                    *puVar1 = *puVar1 | pwVar6[uVar12 + uVar13];
                    uVar13 = uVar13 + 1;
                  } while (uVar15 != uVar13);
                }
                piVar5[lVar11] = -1;
                Vec_IntPush(p->vFree,Entry);
                local_50 = local_50 + 1;
                uVar15 = vGroup->nSize;
              }
            }
            lVar11 = lVar11 + 1;
          } while ((int)lVar11 < (int)uVar15);
        }
      }
      lVar14 = lVar14 + 1;
      lVar10 = lVar10 + 1;
    } while (lVar14 < (int)uVar15);
    if (local_50 != 0) {
      if ((int)uVar15 < 1) {
        uVar7 = 0;
      }
      else {
        piVar5 = vGroup->pArray;
        lVar10 = 0;
        uVar7 = 0;
        do {
          iVar2 = piVar5[lVar10];
          if (iVar2 != -1) {
            if (((int)uVar7 < 0) || (uVar15 <= uVar7)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar13 = (ulong)uVar7;
            uVar7 = uVar7 + 1;
            piVar5[uVar13] = iVar2;
            uVar15 = vGroup->nSize;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)uVar15);
      }
      if ((int)uVar7 <= (int)uVar15) {
        vGroup->nSize = uVar7;
        return local_50;
      }
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
  }
  return 0;
}

Assistant:

int Mop_ManRemoveIdentical( Mop_Man_t * p, Vec_Int_t * vGroup )
{
    int w, c1, c2, iCube1, iCube2, nEqual = 0;
    Vec_IntForEachEntry( vGroup, iCube1, c1 )
    if ( iCube1 != -1 )
    {
        word * pCube1Out, * pCube1 = Mop_ManCubeIn( p, iCube1 );
        Vec_IntForEachEntryStart( vGroup, iCube2, c2, c1+1 )
        if ( iCube2 != -1 )
        {
            word * pCube2Out, * pCube2 = Mop_ManCubeIn( p, iCube2 );
            if ( memcmp(pCube1, pCube2, sizeof(word)*p->nWordsIn) )
                continue;
            // merge cubes
            pCube1Out = Mop_ManCubeOut( p, iCube1 );
            pCube2Out = Mop_ManCubeOut( p, iCube2 );
            for ( w = 0; w < p->nWordsOut; w++ )
                pCube1Out[w] |= pCube2Out[w];
            Vec_IntWriteEntry( vGroup, c2, -1 );
            Vec_IntPush( p->vFree, iCube2 );
            nEqual++;
        }
    }
    if ( nEqual )
        Map_ManGroupCompact( vGroup );
    return nEqual;
}